

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbarinfo_commands.cpp
# Opt level: O3

void __thiscall
CommandDrawShader::FBarShader::FBarShader(FBarShader *this,bool vertical,bool reverse)

{
  BYTE *pBVar1;
  byte *pbVar2;
  long lVar3;
  WORD WVar4;
  undefined7 in_register_00000031;
  WORD WVar5;
  bool bVar6;
  byte bVar7;
  byte bVar8;
  byte bVar9;
  byte bVar10;
  byte bVar11;
  byte bVar12;
  byte bVar13;
  byte bVar14;
  byte bVar15;
  byte bVar16;
  byte bVar17;
  byte bVar18;
  byte bVar19;
  byte bVar20;
  byte bVar21;
  byte bVar22;
  
  FTexture::FTexture(&this->super_FTexture,(char *)0x0,-1);
  (this->super_FTexture)._vptr_FTexture = (_func_int **)&PTR__FTexture_0088ac28;
  bVar6 = (int)CONCAT71(in_register_00000031,vertical) != 0;
  WVar5 = 2;
  WVar4 = 0x100;
  if (bVar6) {
    WVar4 = 2;
  }
  (this->super_FTexture).Width = WVar4;
  if (bVar6) {
    WVar5 = 0x100;
  }
  (this->super_FTexture).Height = WVar5;
  FTexture::CalcBitSize(&this->super_FTexture);
  if (vertical) {
    bVar7 = 0;
    bVar8 = 1;
    bVar9 = 2;
    bVar10 = 3;
    bVar11 = 4;
    bVar12 = 5;
    bVar13 = 6;
    bVar14 = 7;
    bVar15 = 8;
    bVar16 = 9;
    bVar17 = 10;
    bVar18 = 0xb;
    bVar19 = 0xc;
    bVar20 = 0xd;
    bVar21 = 0xe;
    bVar22 = 0xf;
    lVar3 = -0x100;
    if (reverse) {
      do {
        pBVar1 = this->Pixels + lVar3 + 0x100;
        *pBVar1 = bVar7 ^ 0xff;
        pBVar1[1] = bVar8 ^ 0xff;
        pBVar1[2] = bVar9 ^ 0xff;
        pBVar1[3] = bVar10 ^ 0xff;
        pBVar1[4] = bVar11 ^ 0xff;
        pBVar1[5] = bVar12 ^ 0xff;
        pBVar1[6] = bVar13 ^ 0xff;
        pBVar1[7] = bVar14 ^ 0xff;
        pBVar1[8] = bVar15 ^ 0xff;
        pBVar1[9] = bVar16 ^ 0xff;
        pBVar1[10] = bVar17 ^ 0xff;
        pBVar1[0xb] = bVar18 ^ 0xff;
        pBVar1[0xc] = bVar19 ^ 0xff;
        pBVar1[0xd] = bVar20 ^ 0xff;
        pBVar1[0xe] = bVar21 ^ 0xff;
        pBVar1[0xf] = bVar22 ^ 0xff;
        pbVar2 = (byte *)((long)&this->DummySpan[0].TopOffset + lVar3);
        *pbVar2 = bVar7 ^ 0xff;
        pbVar2[1] = bVar8 ^ 0xff;
        pbVar2[2] = bVar9 ^ 0xff;
        pbVar2[3] = bVar10 ^ 0xff;
        pbVar2[4] = bVar11 ^ 0xff;
        pbVar2[5] = bVar12 ^ 0xff;
        pbVar2[6] = bVar13 ^ 0xff;
        pbVar2[7] = bVar14 ^ 0xff;
        pbVar2[8] = bVar15 ^ 0xff;
        pbVar2[9] = bVar16 ^ 0xff;
        pbVar2[10] = bVar17 ^ 0xff;
        pbVar2[0xb] = bVar18 ^ 0xff;
        pbVar2[0xc] = bVar19 ^ 0xff;
        pbVar2[0xd] = bVar20 ^ 0xff;
        pbVar2[0xe] = bVar21 ^ 0xff;
        pbVar2[0xf] = bVar22 ^ 0xff;
        bVar7 = bVar7 + 0x10;
        bVar8 = bVar8 + 0x10;
        bVar9 = bVar9 + 0x10;
        bVar10 = bVar10 + 0x10;
        bVar11 = bVar11 + 0x10;
        bVar12 = bVar12 + 0x10;
        bVar13 = bVar13 + 0x10;
        bVar14 = bVar14 + 0x10;
        bVar15 = bVar15 + 0x10;
        bVar16 = bVar16 + 0x10;
        bVar17 = bVar17 + 0x10;
        bVar18 = bVar18 + 0x10;
        bVar19 = bVar19 + 0x10;
        bVar20 = bVar20 + 0x10;
        bVar21 = bVar21 + 0x10;
        bVar22 = bVar22 + 0x10;
        lVar3 = lVar3 + 0x10;
      } while (lVar3 != 0);
    }
    else {
      do {
        pBVar1 = this->Pixels + lVar3 + 0x100;
        *pBVar1 = bVar7;
        pBVar1[1] = bVar8;
        pBVar1[2] = bVar9;
        pBVar1[3] = bVar10;
        pBVar1[4] = bVar11;
        pBVar1[5] = bVar12;
        pBVar1[6] = bVar13;
        pBVar1[7] = bVar14;
        pBVar1[8] = bVar15;
        pBVar1[9] = bVar16;
        pBVar1[10] = bVar17;
        pBVar1[0xb] = bVar18;
        pBVar1[0xc] = bVar19;
        pBVar1[0xd] = bVar20;
        pBVar1[0xe] = bVar21;
        pBVar1[0xf] = bVar22;
        pbVar2 = (byte *)((long)&this->DummySpan[0].TopOffset + lVar3);
        *pbVar2 = bVar7;
        pbVar2[1] = bVar8;
        pbVar2[2] = bVar9;
        pbVar2[3] = bVar10;
        pbVar2[4] = bVar11;
        pbVar2[5] = bVar12;
        pbVar2[6] = bVar13;
        pbVar2[7] = bVar14;
        pbVar2[8] = bVar15;
        pbVar2[9] = bVar16;
        pbVar2[10] = bVar17;
        pbVar2[0xb] = bVar18;
        pbVar2[0xc] = bVar19;
        pbVar2[0xd] = bVar20;
        pbVar2[0xe] = bVar21;
        pbVar2[0xf] = bVar22;
        bVar7 = bVar7 + 0x10;
        bVar8 = bVar8 + 0x10;
        bVar9 = bVar9 + 0x10;
        bVar10 = bVar10 + 0x10;
        bVar11 = bVar11 + 0x10;
        bVar12 = bVar12 + 0x10;
        bVar13 = bVar13 + 0x10;
        bVar14 = bVar14 + 0x10;
        bVar15 = bVar15 + 0x10;
        bVar16 = bVar16 + 0x10;
        bVar17 = bVar17 + 0x10;
        bVar18 = bVar18 + 0x10;
        bVar19 = bVar19 + 0x10;
        bVar20 = bVar20 + 0x10;
        bVar21 = bVar21 + 0x10;
        bVar22 = bVar22 + 0x10;
        lVar3 = lVar3 + 0x10;
      } while (lVar3 != 0);
    }
  }
  else {
    bVar7 = 0;
    bVar8 = 1;
    bVar9 = 2;
    bVar10 = 3;
    bVar11 = 4;
    bVar12 = 5;
    bVar13 = 6;
    bVar14 = 7;
    lVar3 = 0;
    if (reverse) {
      do {
        pBVar1 = this->Pixels + lVar3 * 2;
        *pBVar1 = bVar7;
        pBVar1[1] = bVar7;
        pBVar1[2] = bVar8;
        pBVar1[3] = bVar8;
        pBVar1[4] = bVar9;
        pBVar1[5] = bVar9;
        pBVar1[6] = bVar10;
        pBVar1[7] = bVar10;
        pBVar1[8] = bVar11;
        pBVar1[9] = bVar11;
        pBVar1[10] = bVar12;
        pBVar1[0xb] = bVar12;
        pBVar1[0xc] = bVar13;
        pBVar1[0xd] = bVar13;
        pBVar1[0xe] = bVar14;
        pBVar1[0xf] = bVar14;
        lVar3 = lVar3 + 8;
        bVar7 = bVar7 + 8;
        bVar8 = bVar8 + 8;
        bVar9 = bVar9 + 8;
        bVar10 = bVar10 + 8;
        bVar11 = bVar11 + 8;
        bVar12 = bVar12 + 8;
        bVar13 = bVar13 + 8;
        bVar14 = bVar14 + 8;
      } while (lVar3 != 0x100);
    }
    else {
      do {
        pBVar1 = this->Pixels + lVar3 * 2;
        *pBVar1 = bVar7 ^ 0xff;
        pBVar1[1] = bVar7 ^ 0xff;
        pBVar1[2] = bVar8 ^ 0xff;
        pBVar1[3] = bVar8 ^ 0xff;
        pBVar1[4] = bVar9 ^ 0xff;
        pBVar1[5] = bVar9 ^ 0xff;
        pBVar1[6] = bVar10 ^ 0xff;
        pBVar1[7] = bVar10 ^ 0xff;
        pBVar1[8] = bVar11 ^ 0xff;
        pBVar1[9] = bVar11 ^ 0xff;
        pBVar1[10] = bVar12 ^ 0xff;
        pBVar1[0xb] = bVar12 ^ 0xff;
        pBVar1[0xc] = bVar13 ^ 0xff;
        pBVar1[0xd] = bVar13 ^ 0xff;
        pBVar1[0xe] = bVar14 ^ 0xff;
        pBVar1[0xf] = bVar14 ^ 0xff;
        lVar3 = lVar3 + 8;
        bVar7 = bVar7 + 8;
        bVar8 = bVar8 + 8;
        bVar9 = bVar9 + 8;
        bVar10 = bVar10 + 8;
        bVar11 = bVar11 + 8;
        bVar12 = bVar12 + 8;
        bVar13 = bVar13 + 8;
        bVar14 = bVar14 + 8;
      } while (lVar3 != 0x100);
    }
  }
  this->DummySpan[0].TopOffset = 0;
  this->DummySpan[0].Length = WVar5;
  this->DummySpan[1].TopOffset = 0;
  this->DummySpan[1].Length = 0;
  return;
}

Assistant:

FBarShader(bool vertical, bool reverse)
			{
				int i;

				Width = vertical ? 2 : 256;
				Height = vertical ? 256 : 2;
				CalcBitSize();

				// Fill the column/row with shading values.
				// Vertical shaders have have minimum alpha at the top
				// and maximum alpha at the bottom, unless flipped by
				// setting reverse to true. Horizontal shaders are just
				// the opposite.
				if (vertical)
				{
					if (!reverse)
					{
						for (i = 0; i < 256; ++i)
						{
							Pixels[i] = i;
							Pixels[256+i] = i;
						}
					}
					else
					{
						for (i = 0; i < 256; ++i)
						{
							Pixels[i] = 255 - i;
							Pixels[256+i] = 255 -i;
						}
					}
				}
				else
				{
					if (!reverse)
					{
						for (i = 0; i < 256; ++i)
						{
							Pixels[i*2] = 255 - i;
							Pixels[i*2+1] = 255 - i;
						}
					}
					else
					{
						for (i = 0; i < 256; ++i)
						{
							Pixels[i*2] = i;
							Pixels[i*2+1] = i;
						}
					}
				}
				DummySpan[0].TopOffset = 0;
				DummySpan[0].Length = vertical ? 256 : 2;
				DummySpan[1].TopOffset = 0;
				DummySpan[1].Length = 0;
			}